

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::PackedSlice::PackedSlice(PackedSlice *this,VarPackedStruct *parent,string *member_name)

{
  element_type *struct__00;
  shared_ptr<kratos::PackedStruct> local_38;
  __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_28;
  shared_ptr<kratos::PackedStruct> *struct_;
  string *member_name_local;
  VarPackedStruct *parent_local;
  PackedSlice *this_local;
  
  struct_ = (shared_ptr<kratos::PackedStruct> *)member_name;
  member_name_local = (string *)parent;
  parent_local = (VarPackedStruct *)this;
  VarSlice::VarSlice(&this->super_VarSlice,&parent->super_Var,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005d72b0;
  this->def_ = (PackedStructFieldDef *)0x0;
  this->original_struct_ = (PackedStruct *)0x0;
  (**(code **)(*(long *)member_name_local + 0x168))(&local_38);
  local_28 = (__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_38;
  struct__00 = std::
               __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(local_28);
  set_up(this,struct__00,(string *)struct_);
  std::shared_ptr<kratos::PackedStruct>::~shared_ptr(&local_38);
  return;
}

Assistant:

PackedSlice::PackedSlice(kratos::VarPackedStruct *parent, const std::string &member_name)
    : VarSlice(parent, 0, 0) {
    auto const &struct_ = parent->packed_struct();
    set_up(*struct_, member_name);
}